

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  size_t sVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_appender<char> out;
  basic_appender<char> out_00;
  type tVar2;
  basic_string_view<char> fmt_00;
  format_specs specs;
  unkbyte10 in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff92;
  float local_68;
  undefined4 uStack_64;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  format_specs local_50;
  ulong uStack_40;
  buffer<char> *local_38;
  format_handler<char> *local_30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_28;
  void *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  undefined4 local_8;
  
  local_28 = args.field_1;
  local_30 = (format_handler<char> *)args.desc_;
  if (((char *)fmt.size_ == (char *)0x2) && (*(short *)fmt.data_ == 0x7d7b)) {
    if ((long)local_30 < 0) {
      if ((int)(type)args.desc_ < 1) {
        tVar2 = none_type;
      }
      else {
        sVar1 = ((local_28.values_)->field_0).string.size;
        local_68 = (float)((local_28.values_)->field_0).long_long_value;
        uStack_64 = (undefined4)((ulong)((local_28.values_)->field_0).long_long_value >> 0x20);
        uStack_60 = (undefined2)sVar1;
        uStack_5e = (undefined6)(sVar1 >> 0x10);
        tVar2 = (local_28.args_)->type_;
      }
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar1 = ((local_28.values_)->field_0).string.size;
        local_68 = (float)((local_28.values_)->field_0).long_long_value;
        uStack_64 = (undefined4)((ulong)((local_28.values_)->field_0).long_long_value >> 0x20);
        uStack_60 = (undefined2)sVar1;
        uStack_5e = (undefined6)(sVar1 >> 0x10);
      }
    }
    switch(tVar2) {
    case int_type:
      write<char,_fmt::v11::basic_appender<char>,_int,_0>((basic_appender<char>)buf,(int)local_68);
      break;
    case uint_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                ((basic_appender<char>)buf,(uint)local_68);
      break;
    case long_long_type:
      write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                ((basic_appender<char>)buf,CONCAT44(uStack_64,local_68));
      break;
    case ulong_long_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                ((basic_appender<char>)buf,CONCAT44(uStack_64,local_68));
      break;
    case int128_type:
      out.container._4_4_ = uStack_64;
      out.container._0_4_ = local_68;
      value._10_6_ = in_stack_ffffffffffffff92;
      value._0_10_ = in_stack_ffffffffffffff88;
      write<char,_fmt::v11::basic_appender<char>,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      out_00.container._4_4_ = uStack_64;
      out_00.container._0_4_ = local_68;
      value_00._10_6_ = in_stack_ffffffffffffff92;
      value_00._0_10_ = in_stack_ffffffffffffff88;
      write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                ((detail *)buf,out_00,(unsigned___int128)value_00);
      break;
    case bool_type:
      local_50.super_basic_specs.data_ = 0x8000;
      local_50._9_7_ = 0xffffffff000000;
      local_50.super_basic_specs.fill_data_[0] = ' ';
      local_50.super_basic_specs.fill_data_[1] = '\0';
      local_50.super_basic_specs.fill_data_[2] = '\0';
      local_50.super_basic_specs.fill_data_[3] = '\0';
      local_50.width._0_1_ = 0;
      write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                ((basic_appender<char>)buf,(bool)(local_68._0_1_ & 1),&local_50,(locale_ref)0x0);
      break;
    case char_type:
      write<char,fmt::v11::basic_appender<char>>((basic_appender<char>)buf,local_68._0_1_);
      break;
    case float_type:
      write<char,_fmt::v11::basic_appender<char>,_float,_0>((basic_appender<char>)buf,local_68);
      break;
    case double_type:
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                ((basic_appender<char>)buf,(double)CONCAT44(uStack_64,local_68));
      break;
    case last_numeric_type:
      specs.width = 0;
      specs.precision = -1;
      specs.super_basic_specs.data_ = 0x8000;
      specs.super_basic_specs.fill_data_[0] = ' ';
      specs.super_basic_specs.fill_data_[1] = '\0';
      specs.super_basic_specs.fill_data_[2] = '\0';
      specs.super_basic_specs.fill_data_[3] = '\0';
      write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
                ((basic_appender<char>)buf,
                 (longdouble)CONCAT28(uStack_60,CONCAT44(uStack_64,local_68)),specs,(locale_ref)0x0)
      ;
      break;
    case cstring_type:
      write<char,fmt::v11::basic_appender<char>>
                ((basic_appender<char>)buf,(char *)CONCAT44(uStack_64,local_68));
      break;
    case string_type:
      copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                ((char *)CONCAT44(uStack_64,local_68),
                 (char *)CONCAT44(uStack_64,local_68) + CONCAT62(uStack_5e,uStack_60),
                 (basic_appender<char>)buf);
      break;
    case pointer_type:
      local_50.super_basic_specs.data_ = 0x8000;
      local_50._9_7_ = 0xffffffff000000;
      local_50.super_basic_specs.fill_data_[0] = ' ';
      local_50.super_basic_specs.fill_data_[1] = '\0';
      local_50.super_basic_specs.fill_data_[2] = '\0';
      local_50.super_basic_specs.fill_data_[3] = '\0';
      local_50.width._0_1_ = 0;
      write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                ((basic_appender<char>)buf,CONCAT44(uStack_64,local_68),&local_50);
      break;
    case custom_type:
      local_18 = 0;
      uStack_10 = 0;
      local_8 = 0;
      local_50.width._0_1_ = 0;
      local_50._9_7_ = 0;
      uStack_40 = 0;
      local_38 = (buffer<char> *)0x0;
      local_50.super_basic_specs = (basic_specs)buf;
      (*(code *)CONCAT62(uStack_5e,uStack_60))(CONCAT44(uStack_64,local_68));
      break;
    default:
      report_error("argument not found");
    }
  }
  else {
    local_50.super_basic_specs.data_ = (uint)fmt.data_;
    local_50.super_basic_specs.fill_data_ = fmt.data_._4_4_;
    local_50.width._0_1_ = (undefined1)fmt.size_;
    local_50._9_7_ = fmt.size_._1_7_;
    uStack_40 = uStack_40 & 0xffffffff00000000;
    fmt_00.size_ = (size_t)&local_50;
    fmt_00.data_ = (char *)fmt.size_;
    local_38 = buf;
    local_20 = loc.locale_;
    parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)fmt.data_,fmt_00,local_30);
  }
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}